

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O2

int CheckRudderSSC32(SSC32 *pSSC32)

{
  int iVar1;
  int iVar2;
  
  iVar1 = SetRudderSSC32(pSSC32,-0.25);
  iVar2 = 1;
  if (iVar1 == 0) {
    mSleep(2000);
    iVar1 = SetRudderSSC32(pSSC32,0.25);
    if (iVar1 == 0) {
      mSleep(2000);
      iVar1 = SetRudderSSC32(pSSC32,0.0);
      if (iVar1 == 0) {
        mSleep(2000);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

inline int CheckRudderSSC32(SSC32* pSSC32)
{
	if (SetRudderSSC32(pSSC32, -0.25) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	mSleep(2000);
	if (SetRudderSSC32(pSSC32, 0.25) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	mSleep(2000);
	if (SetRudderSSC32(pSSC32, 0.0) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	mSleep(2000);

	return EXIT_SUCCESS;
}